

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O1

string * __thiscall
adios2::transport::FileHTTP::SysErrMsg_abi_cxx11_(string *__return_storage_ptr__,FileHTTP *this)

{
  uint uVar1;
  uint __val;
  long lVar2;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  uint __len;
  string __str;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  uVar1 = this->m_Errno;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0065b860;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0065b860;
      }
      if (uVar5 < 10000) goto LAB_0065b860;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0065b860:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_90[0] + (uVar1 >> 0x1f),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x75f84f);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  strerror(this->m_Errno);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileHTTP::SysErrMsg() const
{
    return std::string(": errno = " + std::to_string(m_Errno) + ": " + strerror(m_Errno));
}